

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

void cleanup_ghost(void)

{
  ghost *pgVar1;
  ghost *p;
  ghost_level *pgVar2;
  
  pgVar1 = ghosts;
  if (ghosts == (ghost *)0x0) {
    p = (ghost *)0x0;
  }
  else {
    do {
      for (pgVar2 = pgVar1->level; pgVar2 != (ghost_level *)0x0; pgVar2 = pgVar2->next) {
        if (pgVar2->blow_effect1 != (char *)0x0) {
          string_free(pgVar2->blow_effect1);
        }
        if (pgVar2->blow_effect2 != (char *)0x0) {
          string_free(pgVar2->blow_effect2);
        }
      }
      string_free(pgVar1->name);
      pgVar1 = pgVar1->next;
      p = ghosts;
    } while (pgVar1 != (ghost *)0x0);
  }
  mem_free(p);
  return;
}

Assistant:

static void cleanup_ghost(void)
{
	struct ghost *g;
	for (g = ghosts; g; g = g->next) {
		struct ghost_level *l;
		for (l = g->level; l; l = l->next) {
			if (l->blow_effect1) string_free(l->blow_effect1);
			if (l->blow_effect2) string_free(l->blow_effect2);
		}
		string_free(g->name);
	}
	mem_free(ghosts);
}